

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_matrix.c
# Opt level: O2

int gdAffineIdentity(double *dst)

{
  *dst = 1.0;
  dst[1] = 0.0;
  dst[2] = 0.0;
  dst[3] = 1.0;
  dst[4] = 0.0;
  dst[5] = 0.0;
  return 1;
}

Assistant:

BGD_DECLARE(int) gdAffineIdentity (double dst[6])
{
	dst[0] = 1;
	dst[1] = 0;
	dst[2] = 0;
	dst[3] = 1;
	dst[4] = 0;
	dst[5] = 0;
	return GD_TRUE;
}